

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_26ba73::PulseCapture::start(PulseCapture *this)

{
  pa_operation *op;
  unique_lock<std::mutex> plock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&(this->mMainloop).mMutex);
  op = (pa_operation *)
       (*(anonymous_namespace)::ppa_stream_cork)
                 (this->mStream,0,PulseMainloop::streamSuccessCallbackC,&this->mMainloop);
  PulseMainloop::waitForOperation(&this->mMainloop,op,&local_20);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void PulseCapture::start()
{
    auto plock = mMainloop.getUniqueLock();
    pa_operation *op{pa_stream_cork(mStream, 0, &PulseMainloop::streamSuccessCallbackC,
        &mMainloop)};
    mMainloop.waitForOperation(op, plock);
}